

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::BuiltinPrecisionTests::
ApplyVar<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
::ApplyVar(ApplyVar<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
           *this,ApplyFunc *func,VariableP<float> *arg0,VariableP<float> *arg1,
          VariableP<float> *arg2,VariableP<deqp::gls::BuiltinPrecisionTests::Void> *arg3)

{
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
  SStack_68;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_58;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_48;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_38;
  
  VariableP::operator_cast_to_ExprP((VariableP *)&local_38);
  VariableP::operator_cast_to_ExprP((VariableP *)&local_48);
  VariableP::operator_cast_to_ExprP((VariableP *)&local_58);
  VariableP::operator_cast_to_ExprP((VariableP *)&SStack_68);
  Apply<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Apply(&this->
           super_Apply<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
          ,func,(ExprP<float> *)&local_38,(ExprP<float> *)&local_48,(ExprP<float> *)&local_58,
          (ExprP<deqp::gls::BuiltinPrecisionTests::Void> *)&SStack_68);
  de::
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>::
  release(&SStack_68);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_58);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_48);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_38);
  (this->
  super_Apply<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ).super_Expr<float>.super_ExprBase._vptr_ExprBase = (_func_int **)&PTR__Apply_00a20d40;
  return;
}

Assistant:

ApplyVar	(const ApplyFunc&			func,
									 const VariableP<Arg0>&		arg0,
									 const VariableP<Arg1>&		arg1,
									 const VariableP<Arg2>&		arg2,
									 const VariableP<Arg3>&		arg3)
							: Apply<Sig> (func, arg0, arg1, arg2, arg3) {}